

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  char **this_00;
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var3;
  bool bVar4;
  TokenType TVar5;
  Result RVar6;
  Result RVar7;
  Expr *pEVar8;
  ExprList *pEVar9;
  long *plVar10;
  Block *pBVar11;
  long lVar12;
  ExprList cond;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  Location loc;
  int __flags;
  undefined1 local_f8 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_e8;
  char *local_d8 [2];
  char local_c8 [16];
  string local_b8 [16];
  long local_a8 [2];
  _Head_base<0UL,_wabt::Expr_*,_false> local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  _func_int **local_78;
  Expr *pEStack_70;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_68;
  undefined8 uStack_60;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  _Head_base<0UL,_wabt::Expr_*,_false> local_48;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  
  TVar5 = Peek(this,0);
  RVar7.enum_ = Error;
  if (TVar5 != Lpar) {
    return (Result)Error;
  }
  TVar5 = Peek(this,1);
  bVar4 = anon_unknown_1::IsPlainInstr(TVar5);
  if (!bVar4) {
    GetToken((Token *)local_f8,this);
    local_68.offset = (size_t)local_e8.field_1.offset;
    uStack_60 = local_e8._8_8_;
    local_78 = (_func_int **)local_f8._0_8_;
    pEStack_70 = (Expr *)local_f8._8_8_;
    TVar5 = Peek(this,1);
    if ((int)TVar5 < 0x58) {
      if (TVar5 != Block) {
        if (TVar5 != If) {
LAB_00193883:
          __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0xc0f,"Result wabt::WastParser::ParseExpr(ExprList *)");
        }
        Consume((Token *)local_f8,this);
        Consume((Token *)local_f8,this);
        pEVar8 = (Expr *)operator_new(0x1c0);
        (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        pEVar8->_vptr_Expr = (_func_int **)&PTR__Expr_00248738;
        (pEVar8->loc).filename._M_len = (size_t)local_78;
        (pEVar8->loc).filename._M_str = (char *)pEStack_70;
        (pEVar8->loc).field_1.field_1.offset = local_68.offset;
        *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uStack_60;
        pEVar8->type_ = If;
        pEVar8->_vptr_Expr = (_func_int **)&PTR__IfExpr_0024a188;
        Block::Block((Block *)(pEVar8 + 1));
        pEVar8[6].loc.field_1.field_1.offset = 0;
        *(undefined8 *)((long)&pEVar8[6].loc.field_1 + 8) = 0;
        pEVar8[6].loc.filename._M_len = 0;
        pEVar8[6].loc.filename._M_str = (char *)0x0;
        pEVar8[6].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
        pEVar8[6].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
        pEVar8[6].type_ = AtomicLoad;
        RVar6 = ParseLabelOpt(this,(string *)(pEVar8 + 1));
        RVar7.enum_ = Error;
        if ((RVar6.enum_ == Error) ||
           (RVar6 = ParseBlockDeclaration(this,(BlockDeclaration *)&pEVar8[1].loc.filename._M_str),
           RVar6.enum_ == Error)) {
LAB_00192f8e:
          bVar4 = false;
        }
        else {
          bVar4 = PeekMatchExpr(this);
          if (bVar4) {
            local_f8._0_8_ = (_func_int **)0x0;
            local_f8._8_8_ = (Expr *)0x0;
            local_e8.field_1.offset =
                 (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
            RVar6 = ParseExpr(this,(ExprList *)local_f8);
            pp_Var2 = (_func_int **)local_f8._0_8_;
            if (RVar6.enum_ != Error) {
              uStack_90 = 0;
              __flags = (int)(Expr *)local_f8;
              local_98._M_head_impl = (Expr *)local_f8;
              intrusive_list<wabt::Expr>::splice
                        (exprs,(int)exprs,(__off64_t *)0x0,__flags,(__off64_t *)local_f8,
                         local_f8._0_8_,__flags);
              pp_Var2 = (_func_int **)local_f8._0_8_;
            }
            while (pp_Var2 != (_func_int **)0x0) {
              pp_Var1 = (_func_int **)pp_Var2[1];
              (**(code **)(*pp_Var2 + 8))();
              pp_Var2 = pp_Var1;
            }
            if (RVar6.enum_ == Error) goto LAB_00192f8e;
          }
          bVar4 = MatchLpar(this,Then);
          if (!bVar4) {
            bVar4 = PeekMatchExpr(this);
            if (bVar4) {
              RVar6 = ParseExpr(this,(ExprList *)
                                     &pEVar8[5].super_intrusive_list_base<wabt::Expr>.prev_);
              if (RVar6.enum_ != Error) {
                GetToken((Token *)local_f8,this);
                *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
                 &pEVar8[5].type_ = local_e8.field_1.offset;
                pEVar8[6]._vptr_Expr = (_func_int **)local_e8._8_8_;
                pEVar8[5].loc.field_1.field_1.offset = local_f8._0_8_;
                *(undefined8 *)((long)&pEVar8[5].loc.field_1 + 8) = local_f8._8_8_;
                bVar4 = PeekMatchExpr(this);
                if (!bVar4) goto LAB_00193604;
LAB_001935c5:
                RVar6 = ParseExpr(this,(ExprList *)&pEVar8[6].super_intrusive_list_base<wabt::Expr>)
                ;
LAB_001935d0:
                if (RVar6.enum_ != Error) goto LAB_001935d9;
              }
            }
            else {
              Match(this,Lpar);
              local_f8._0_8_ = local_f8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"then block","");
              local_98._M_head_impl = (Expr *)0x0;
              uStack_90 = 0;
              local_88 = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_98,(string *)local_f8,local_d8);
              RVar7 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&local_98,"(then ...)");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_98);
              if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                operator_delete((void *)local_f8._0_8_,(long)local_e8.field_1.offset + 1);
              }
            }
            goto LAB_00192f8e;
          }
          RVar6 = ParseTerminatingInstrList
                            (this,(ExprList *)&pEVar8[5].super_intrusive_list_base<wabt::Expr>.prev_
                            );
          if (RVar6.enum_ == Error) goto LAB_00192f8e;
          GetToken((Token *)local_f8,this);
          *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
           &pEVar8[5].type_ = local_e8.field_1.offset;
          pEVar8[6]._vptr_Expr = (_func_int **)local_e8._8_8_;
          pEVar8[5].loc.field_1.field_1.offset = local_f8._0_8_;
          *(undefined8 *)((long)&pEVar8[5].loc.field_1 + 8) = local_f8._8_8_;
          RVar6 = Expect(this,Rpar);
          if (RVar6.enum_ == Error) goto LAB_00192f8e;
          bVar4 = MatchLpar(this,Else);
          if (bVar4) {
            RVar6 = ParseTerminatingInstrList
                              (this,(ExprList *)&pEVar8[6].super_intrusive_list_base<wabt::Expr>);
            if (RVar6.enum_ != Error) {
              RVar6 = Expect(this,Rpar);
              goto LAB_001935d0;
            }
            goto LAB_00192f8e;
          }
          bVar4 = PeekMatchExpr(this);
          if (bVar4) goto LAB_001935c5;
LAB_001935d9:
          GetToken((Token *)local_f8,this);
          ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
          ((long)&pEVar8[6].loc.field_1 + 8))->offset = (size_t)local_e8.field_1.offset;
          *(undefined8 *)&pEVar8[6].type_ = local_e8._8_8_;
          pEVar8[6].loc.filename._M_str = (char *)local_f8._0_8_;
          pEVar8[6].loc.field_1.field_1.offset = local_f8._8_8_;
LAB_00193604:
          local_48._M_head_impl = pEVar8;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_48);
          if (local_48._M_head_impl != (Expr *)0x0) {
            (*(local_48._M_head_impl)->_vptr_Expr[1])();
          }
          local_48._M_head_impl = (Expr *)0x0;
          bVar4 = true;
          pEVar8 = (Expr *)0x0;
        }
        if (pEVar8 != (Expr *)0x0) {
          (*pEVar8->_vptr_Expr[1])(pEVar8);
        }
        goto joined_r0x001932c0;
      }
      Consume((Token *)local_f8,this);
      Consume((Token *)local_f8,this);
      pEVar8 = (Expr *)operator_new(0x188);
      (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      pEVar8->_vptr_Expr = (_func_int **)&PTR__Expr_00248738;
      (pEVar8->loc).filename._M_len = (size_t)local_78;
      (pEVar8->loc).filename._M_str = (char *)pEStack_70;
      (pEVar8->loc).field_1.field_1.offset = local_68.offset;
      *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uStack_60;
      pEVar8->type_ = Block;
      pEVar8->_vptr_Expr = (_func_int **)&PTR__BlockExprBase_0024a0e8;
      pBVar11 = (Block *)(pEVar8 + 1);
      Block::Block(pBVar11);
      RVar7 = ParseLabelOpt(this,(string *)pBVar11);
      if ((RVar7.enum_ == Error) || (RVar7 = ParseBlock(this,pBVar11), RVar7.enum_ == Error))
      goto LAB_001932a7;
      local_38._M_head_impl = pEVar8;
      intrusive_list<wabt::Expr>::push_back
                (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
      if (local_38._M_head_impl != (Expr *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Expr[1])();
      }
      local_38._M_head_impl = (Expr *)0x0;
LAB_00193360:
      bVar4 = true;
      pEVar8 = (Expr *)0x0;
    }
    else {
      if (TVar5 == Loop) {
        Consume((Token *)local_f8,this);
        Consume((Token *)local_f8,this);
        pEVar8 = (Expr *)operator_new(0x188);
        (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        pEVar8->_vptr_Expr = (_func_int **)&PTR__Expr_00248738;
        (pEVar8->loc).filename._M_len = (size_t)local_78;
        (pEVar8->loc).filename._M_str = (char *)pEStack_70;
        (pEVar8->loc).field_1.field_1.offset = local_68.offset;
        *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uStack_60;
        pEVar8->type_ = Loop;
        pEVar8->_vptr_Expr = (_func_int **)&PTR__BlockExprBase_0024a138;
        pBVar11 = (Block *)(pEVar8 + 1);
        Block::Block(pBVar11);
        RVar7 = ParseLabelOpt(this,(string *)pBVar11);
        if ((RVar7.enum_ == Error) || (RVar7 = ParseBlock(this,pBVar11), RVar7.enum_ == Error))
        goto LAB_001932a7;
        local_40._M_head_impl = pEVar8;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
        if (local_40._M_head_impl != (Expr *)0x0) {
          (*(local_40._M_head_impl)->_vptr_Expr[1])();
        }
        local_40._M_head_impl = (Expr *)0x0;
        goto LAB_00193360;
      }
      if (TVar5 != Try) goto LAB_00193883;
      Consume((Token *)local_f8,this);
      Consume((Token *)local_f8,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)local_f8);
      pEVar8 = (Expr *)operator_new(0x1e8);
      (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      pEVar8->_vptr_Expr = (_func_int **)&PTR__Expr_00248738;
      (pEVar8->loc).filename._M_len = (size_t)local_78;
      (pEVar8->loc).filename._M_str = (char *)pEStack_70;
      (pEVar8->loc).field_1.field_1.offset = local_68.offset;
      *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uStack_60;
      *(undefined8 *)&pEVar8->type_ = 0x3c;
      pEVar8->_vptr_Expr = (_func_int **)&PTR__TryExpr_0024a1d8;
      Block::Block((Block *)(pEVar8 + 1));
      pEVar8[6].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      pEVar8[6].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
      pEVar8[6].loc.filename._M_len = 0;
      this_00 = &pEVar8[6].loc.filename._M_str;
      Var::Var((Var *)this_00);
      RVar7 = ParseLabelOpt(this,(string *)(pEVar8 + 1));
      if (((((RVar7.enum_ == Error) ||
            (RVar7 = ParseBlockDeclaration(this,(BlockDeclaration *)&pEVar8[1].loc.filename._M_str),
            RVar7.enum_ == Error)) || (RVar7 = Expect(this,Lpar), RVar7.enum_ == Error)) ||
          ((RVar7 = Expect(this,Do), RVar7.enum_ == Error ||
           (RVar7 = ParseInstrList(this,(ExprList *)
                                        &pEVar8[5].super_intrusive_list_base<wabt::Expr>.prev_),
           RVar7.enum_ == Error)))) || (RVar7 = Expect(this,Rpar), RVar7.enum_ == Error))
      goto LAB_001932a7;
      TVar5 = Peek(this,0);
      if (TVar5 == Lpar) {
        Consume((Token *)local_f8,this);
        TVar5 = Peek(this,0);
        if (TVar5 - Catch < 2) {
          RVar7 = ParseCatchExprList(this,(CatchVector *)
                                          &pEVar8[6].super_intrusive_list_base<wabt::Expr>);
          if (RVar7.enum_ == Error) goto LAB_001932a7;
          *(undefined4 *)&pEVar8->field_0x3c = 1;
          goto LAB_00193759;
        }
        if (TVar5 != Delegate) {
          local_f8._0_8_ = local_f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"catch","");
          local_d8[0] = local_c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"catch_all","");
          plVar10 = local_a8;
          local_b8._0_8_ = plVar10;
          std::__cxx11::string::_M_construct<char_const*>(local_b8,"delegate","");
          local_98._M_head_impl = (Expr *)0x0;
          uStack_90 = 0;
          local_88 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                     (string *)local_f8,&local_98);
          ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_98,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_98);
          lVar12 = -0x60;
          do {
            if (plVar10 != (long *)plVar10[-2]) {
              operator_delete((long *)plVar10[-2],*plVar10 + 1);
            }
            plVar10 = plVar10 + -4;
            lVar12 = lVar12 + 0x20;
          } while (lVar12 != 0);
          goto LAB_00193759;
        }
        Consume((Token *)local_f8,this);
        Var::Var((Var *)local_f8);
        RVar7 = ParseVar(this,(Var *)local_f8);
        if (RVar7.enum_ == Error) {
          Var::~Var((Var *)local_f8);
        }
        else {
          Var::operator=((Var *)this_00,(Var *)local_f8);
          *(undefined4 *)&pEVar8->field_0x3c = 2;
          RVar7 = Expect(this,Rpar);
          Var::~Var((Var *)local_f8);
          if (RVar7.enum_ != Error) goto LAB_00193759;
        }
      }
      else {
LAB_00193759:
        local_f8._0_8_ = local_f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"a valid try clause","");
        local_98._M_head_impl = (Expr *)0x0;
        uStack_90 = 0;
        local_88 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                   (string *)local_f8);
        RVar7 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_98,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,(long)local_e8.field_1.offset + 1);
        }
        if (RVar7.enum_ != Error) {
          GetToken((Token *)local_f8,this);
          *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
           &pEVar8[5].type_ = local_e8.field_1.offset;
          pEVar8[6]._vptr_Expr = (_func_int **)local_e8._8_8_;
          pEVar8[5].loc.field_1.field_1.offset = local_f8._0_8_;
          *(undefined8 *)((long)&pEVar8[5].loc.field_1 + 8) = local_f8._8_8_;
          local_50._M_head_impl = pEVar8;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50);
          if (local_50._M_head_impl != (Expr *)0x0) {
            (*(local_50._M_head_impl)->_vptr_Expr[1])();
          }
          local_50._M_head_impl = (Expr *)0x0;
          goto LAB_00193360;
        }
      }
LAB_001932a7:
      bVar4 = false;
    }
    if (pEVar8 != (Expr *)0x0) {
      (*pEVar8->_vptr_Expr[1])(pEVar8);
    }
    RVar7.enum_ = Error;
    goto joined_r0x001932c0;
  }
  Consume((Token *)local_f8,this);
  local_98._M_head_impl = (Expr *)0x0;
  RVar6 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_98
                         );
  if ((RVar6.enum_ == Error) || (RVar6 = ParseExprList(this,exprs), RVar6.enum_ == Error)) {
LAB_00192e38:
    bVar4 = false;
  }
  else {
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"an expr","");
    local_78 = (_func_int **)0x0;
    pEStack_70 = (Expr *)0x0;
    local_68.offset = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (string *)local_f8,local_d8);
    RVar6 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_78,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,(long)local_e8.field_1.offset + 1);
    }
    _Var3._M_head_impl = local_98._M_head_impl;
    if (RVar6.enum_ == Error) goto LAB_00192e38;
    local_98._M_head_impl = (Expr *)0x0;
    if ((((_Var3._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
       (((_Var3._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                    ,0x1bd,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar8 = exprs->last_;
    pEVar9 = exprs;
    if (pEVar8 != (Expr *)0x0) {
      ((_Var3._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar8;
      pEVar9 = (ExprList *)&pEVar8->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar9->first_ = _Var3._M_head_impl;
    exprs->last_ = _Var3._M_head_impl;
    exprs->size_ = exprs->size_ + 1;
    bVar4 = true;
  }
  if (local_98._M_head_impl != (Expr *)0x0) {
    (*(code *)(((Expr *)(local_98._M_head_impl)->_vptr_Expr)->super_intrusive_list_base<wabt::Expr>)
              .next_)();
  }
joined_r0x001932c0:
  if (bVar4) {
    RVar7 = Expect(this,Rpar);
    RVar7.enum_ = (Enum)(RVar7.enum_ == Error);
  }
  return (Result)RVar7.enum_;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = std::make_unique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = std::make_unique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = std::make_unique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = std::make_unique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        EXPECT(Lpar);
        EXPECT(Do);
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        EXPECT(Rpar);
        if (PeekMatch(TokenType::Lpar)) {
          Consume();
          TokenType type = Peek();
          switch (type) {
            case TokenType::Catch:
            case TokenType::CatchAll:
              CHECK_RESULT(ParseCatchExprList(&expr->catches));
              expr->kind = TryKind::Catch;
              break;
            case TokenType::Delegate: {
              Consume();
              Var var;
              CHECK_RESULT(ParseVar(&var));
              expr->delegate_target = var;
              expr->kind = TryKind::Delegate;
              EXPECT(Rpar);
              break;
            }
            default:
              ErrorExpected({"catch", "catch_all", "delegate"});
              break;
          }
        }
        CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}